

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGenerator::MessagePath_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGenerator *this,string_view path)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *b;
  string_view prefix;
  string_view prefix_00;
  string_view text;
  string_view path_local;
  string res;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  res._M_dataplus._M_p = (pointer)&res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = '\0';
  prefix._M_str = (this->ProjectDirs_).Source._M_dataplus._M_p;
  prefix._M_len = (this->ProjectDirs_).Source._M_string_length;
  bVar1 = cmHasPrefix(path,prefix);
  if (bVar1) {
    local_50 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&path_local,(this->ProjectDirs_).Source._M_string_length,
                          0xffffffffffffffff);
    b = &local_50;
    cmStrCat<char_const(&)[5],std::basic_string_view<char,std::char_traits<char>>>
              (&local_40,(char (*) [5])"SRC:",b);
  }
  else {
    b = (basic_string_view<char,_std::char_traits<char>_> *)
        (this->ProjectDirs_).Binary._M_dataplus._M_p;
    prefix_00._M_str = (char *)b;
    prefix_00._M_len = (this->ProjectDirs_).Binary._M_string_length;
    bVar1 = cmHasPrefix(path,prefix_00);
    if (bVar1) {
      local_50 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&path_local,(this->ProjectDirs_).Binary._M_string_length,
                            0xffffffffffffffff);
      b = &local_50;
      cmStrCat<char_const(&)[5],std::basic_string_view<char,std::char_traits<char>>>
                (&local_40,(char (*) [5])"BIN:",b);
    }
    else {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_40,&path_local,(allocator<char> *)&local_50);
    }
  }
  std::__cxx11::string::operator=((string *)&res,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  text._M_str = (char *)b;
  text._M_len = (size_t)res._M_dataplus._M_p;
  cmQtAutoGen::Quoted_abi_cxx11_(__return_storage_ptr__,(cmQtAutoGen *)res._M_string_length,text);
  std::__cxx11::string::~string((string *)&res);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerator::MessagePath(cm::string_view path) const
{
  std::string res;
  if (cmHasPrefix(path, this->ProjectDirs().Source)) {
    res = cmStrCat("SRC:", path.substr(this->ProjectDirs().Source.size()));
  } else if (cmHasPrefix(path, this->ProjectDirs().Binary)) {
    res = cmStrCat("BIN:", path.substr(this->ProjectDirs().Binary.size()));
  } else {
    res = std::string(path);
  }
  return cmQtAutoGen::Quoted(res);
}